

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawSelectedInventory::Parse
          (CommandDrawSelectedInventory *this,FScanner *sc,bool fullScreenOffsets)

{
  SBarInfoCoordinate SVar1;
  bool bVar2;
  EColorRange EVar3;
  FFont *pFVar4;
  
  *(undefined4 *)&(this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.field_0x34 = 0xc;
  (this->super_CommandDrawNumber).value = SELECTEDINVENTORY;
  do {
    bVar2 = FScanner::CheckToken(sc,0x102);
    if (!bVar2) {
      FScanner::MustGetToken(sc,0x101);
    }
    if (sc->TokenType != 0x101) goto LAB_004c56a8;
    bVar2 = FScanner::Compare(sc,"alternateonempty");
    if (bVar2) {
      this->alternateOnEmpty = true;
    }
    else {
      bVar2 = FScanner::Compare(sc,"artiflash");
      if (bVar2) {
        this->artiflash = true;
      }
      else {
        bVar2 = FScanner::Compare(sc,"alwaysshowcounter");
        if (bVar2) {
          this->alwaysShowCounter = true;
        }
        else {
          bVar2 = FScanner::Compare(sc,"itemflash");
          if (bVar2) {
            this->itemflash = true;
          }
          else {
            bVar2 = FScanner::Compare(sc,"center");
            if (bVar2) {
              (this->super_CommandDrawImage).offset = CENTER;
            }
            else {
              bVar2 = FScanner::Compare(sc,"centerbottom");
              if (bVar2) {
                (this->super_CommandDrawImage).offset = CENTER_BOTTOM;
              }
              else {
                bVar2 = FScanner::Compare(sc,"drawshadow");
                if (!bVar2) {
LAB_004c56a8:
                  pFVar4 = V_GetFont(sc->String);
                  (this->super_CommandDrawNumber).super_CommandDrawString.font = pFVar4;
                  if (pFVar4 == (FFont *)0x0) {
                    FScanner::ScriptMessage(sc,"Unknown font \'%s\'.",sc->String);
                    (this->super_CommandDrawNumber).super_CommandDrawString.font = SmallFont;
                  }
                  FScanner::MustGetToken(sc,0x2c);
                  SBarInfoCommand::GetCoordinates
                            ((SBarInfoCommand *)this,sc,fullScreenOffsets,
                             &(this->super_CommandDrawImage).imgx,
                             &(this->super_CommandDrawImage).imgy);
                  SVar1 = (this->super_CommandDrawImage).imgy;
                  (this->super_CommandDrawNumber).super_CommandDrawString.startX =
                       (SBarInfoCoordinate)((int)(this->super_CommandDrawImage).imgx + 0x3c);
                  (this->super_CommandDrawNumber).super_CommandDrawString.y =
                       (SBarInfoCoordinate)((int)SVar1 + 0x30);
                  (this->super_CommandDrawNumber).normalTranslation = CR_GOLD;
                  bVar2 = FScanner::CheckToken(sc,0x2c);
                  if (bVar2) {
                    SBarInfoCommand::GetCoordinates
                              ((SBarInfoCommand *)&this->super_CommandDrawNumber,sc,
                               fullScreenOffsets,
                               &(this->super_CommandDrawNumber).super_CommandDrawString.startX,
                               &(this->super_CommandDrawNumber).super_CommandDrawString.y);
                    bVar2 = FScanner::CheckToken(sc,0x2c);
                    if (bVar2) {
                      EVar3 = SBarInfoCommand::GetTranslation
                                        ((SBarInfoCommand *)&this->super_CommandDrawNumber,sc);
                      (this->super_CommandDrawNumber).normalTranslation = EVar3;
                      bVar2 = FScanner::CheckToken(sc,0x2c);
                      if (bVar2) {
                        FScanner::MustGetToken(sc,0x104);
                        (this->super_CommandDrawNumber).super_CommandDrawString.spacing = sc->Number
                        ;
                      }
                    }
                  }
                  if (this->alternateOnEmpty == true) {
                    SBarInfoCommandFlowControl::Parse
                              ((SBarInfoCommandFlowControl *)this,sc,fullScreenOffsets);
                    return;
                  }
                  FScanner::MustGetToken(sc,0x3b);
                  return;
                }
                bVar2 = FScanner::CheckToken(sc,0x28);
                if (bVar2) {
                  FScanner::MustGetToken(sc,0x104);
                  (this->super_CommandDrawNumber).super_CommandDrawString.shadowX = sc->Number;
                  FScanner::MustGetToken(sc,0x2c);
                  FScanner::MustGetToken(sc,0x104);
                  (this->super_CommandDrawNumber).super_CommandDrawString.shadowY = sc->Number;
                  FScanner::MustGetToken(sc,0x29);
                }
                (this->super_CommandDrawNumber).super_CommandDrawString.shadow = true;
              }
            }
          }
        }
      }
    }
    bVar2 = FScanner::CheckToken(sc,0x7c);
    if (!bVar2) {
      FScanner::MustGetToken(sc,0x2c);
    }
  } while( true );
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			type = SELECTEDINVENTORYICON;
			value = SELECTEDINVENTORY;
			while(true) //go until we get a font (non-flag)
			{
				if(!sc.CheckToken(TK_StringConst))
					sc.MustGetToken(TK_Identifier);
				bool isFont = sc.TokenType != TK_Identifier;
				if(sc.TokenType == TK_Identifier)
				{
					if(sc.Compare("alternateonempty"))
						alternateOnEmpty = true;
					else if(sc.Compare("artiflash"))
						artiflash = true;
					else if(sc.Compare("alwaysshowcounter"))
						alwaysShowCounter = true;
					else if(sc.Compare("itemflash"))
						itemflash = true;
					else if(sc.Compare("center"))
						offset = CENTER;
					else if(sc.Compare("centerbottom"))
						offset = static_cast<Offset> (HMIDDLE|BOTTOM);
					else if(sc.Compare("drawshadow"))
					{
						if(sc.CheckToken('('))
						{
							sc.MustGetToken(TK_IntConst);
							shadowX = sc.Number;
							sc.MustGetToken(',');
							sc.MustGetToken(TK_IntConst);
							shadowY = sc.Number;
							sc.MustGetToken(')');
						}
						shadow = true;
					}
					else
						isFont = true;
				}
				if(isFont)
				{
					font = V_GetFont(sc.String);
					if(font == NULL)
					{
						sc.ScriptMessage("Unknown font '%s'.", sc.String);
						font = SmallFont;
					}
					sc.MustGetToken(',');
					break;
				}
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			CommandDrawImage::GetCoordinates(sc, fullScreenOffsets, imgx, imgy);
			startX = imgx + 30;
			y = imgy + 24;
			normalTranslation = CR_GOLD;
			if(sc.CheckToken(',')) //more font information
			{
				CommandDrawNumber::GetCoordinates(sc, fullScreenOffsets, startX, y);
				if(sc.CheckToken(','))
				{
					normalTranslation = CommandDrawNumber::GetTranslation(sc);
					if(sc.CheckToken(','))
					{
						sc.MustGetToken(TK_IntConst);
						spacing = sc.Number;
					}
				}
			}
			if(alternateOnEmpty)
				SBarInfoCommandFlowControl::Parse(sc, fullScreenOffsets);
			else
				sc.MustGetToken(';');
		}